

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

Gia_Man_t * Gia_ManFromIfLogic(If_Man_t *pIfMan)

{
  word wVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  If_Par_t *pIVar6;
  Gia_Man_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *p_04;
  Vec_Int_t *p_05;
  If_Obj_t *pIfObj;
  If_Cut_t *pCut;
  If_Obj_t *pIVar7;
  word *pwVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  int *piVar11;
  FILE *__s;
  size_t __size;
  byte bVar12;
  byte bVar13;
  int extraout_EDX;
  int extraout_EDX_00;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  word *pwVar18;
  word *pwVar19;
  ulong uVar20;
  Vec_Int_t *local_440;
  Vec_Int_t *local_438;
  sat_solver *local_430;
  Vec_Str_t *local_428;
  char Buffer [1000];
  
  if ((pIfMan->pPars->fDeriveLuts != 0) && (pIfMan->pPars->fTruth == 0)) {
    __assert_fail("!pIfMan->pPars->fDeriveLuts || pIfMan->pPars->fTruth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                  ,0x702,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  p = Vec_IntStart(pIfMan->vObjs->nSize);
  p_00 = Vec_IntStart(1);
  pIVar6 = pIfMan->pPars;
  if ((pIVar6->fDeriveLuts == 0) ||
     ((((pIVar6->pLutStruct == (char *)0x0 && (pIVar6->fEnableCheck75 == 0)) &&
       (pIVar6->fEnableCheck75u == 0)) && (pIVar6->fEnableCheck07 == 0)))) {
    local_440 = (Vec_Int_t *)0x0;
  }
  else {
    local_440 = Vec_IntAlloc(1000);
    Vec_IntPush(local_440,0);
    pIVar6 = pIfMan->pPars;
  }
  if (pIVar6->fUseDsdTune == 0) {
    local_428 = (Vec_Str_t *)0x0;
    local_438 = (Vec_Int_t *)0x0;
  }
  else {
    iVar2 = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
    iVar3 = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
    uVar4 = iVar3 + iVar2 + 1;
    local_438 = Vec_IntAlloc(1000);
    Vec_IntPush(local_438,0);
    Vec_IntPush(local_438,(((int)uVar4 >> 5) + 1) - (uint)((uVar4 & 0x1f) == 0));
    local_428 = Vec_StrAlloc(1000);
  }
  p_01 = Gia_ManStart(pIfMan->vObjs->nSize);
  p_02 = Vec_IntAlloc(1000);
  p_03 = Vec_IntAlloc(0x10000);
  p_04 = Vec_IntAlloc(0x10);
  p_05 = Vec_IntAlloc(0x10);
  If_ManCleanCutData(pIfMan);
  iVar2 = 0;
  local_430 = (sat_solver *)0x0;
  do {
    if (pIfMan->vObjs->nSize <= iVar2) {
      Vec_IntFree(p_02);
      Vec_IntFree(p_03);
      Vec_IntFree(p_04);
      Vec_IntFree(p_05);
      iVar2 = extraout_EDX;
      if (local_430 != (sat_solver *)0x0) {
        sat_solver_delete(local_430);
        iVar2 = extraout_EDX_00;
      }
      iVar3 = p_01->nObjs;
      if (iVar3 < p->nSize) {
        p->nSize = iVar3;
      }
      else {
        Vec_IntFillExtra(p,iVar3,iVar2);
        iVar3 = p_01->nObjs;
        if (p->nSize != iVar3) {
          __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                        ,0x798,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
        }
      }
      for (iVar2 = 0; iVar2 < iVar3; iVar2 = iVar2 + 1) {
        iVar3 = Vec_IntEntry(p,iVar2);
        if (0 < iVar3) {
          Vec_IntAddToEntry(p,iVar2,p_01->nObjs);
        }
        iVar3 = p->nSize;
      }
      iVar2 = p_00->nSize;
      iVar3 = 0;
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      for (; iVar2 != iVar3; iVar3 = iVar3 + 1) {
        iVar5 = Vec_IntEntry(p_00,iVar3);
        Vec_IntPush(p,iVar5);
      }
      Vec_IntFree(p_00);
      if (p_01->vMapping != (Vec_Int_t *)0x0) {
        __assert_fail("pNew->vMapping == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                      ,0x79f,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
      }
      if (p_01->vPacking != (Vec_Int_t *)0x0) {
        __assert_fail("pNew->vPacking == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                      ,0x7a0,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
      }
      if (p_01->vConfigs == (Vec_Int_t *)0x0) {
        if (p_01->pCellStr != (char *)0x0) {
          __assert_fail("pNew->pCellStr == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                        ,0x7a2,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
        }
        p_01->vMapping = p;
        p_01->vPacking = local_440;
        p_01->vConfigs = local_438;
        if (local_438 == (Vec_Int_t *)0x0) {
          p_01->pCellStr = (char *)0x0;
        }
        else {
          pcVar9 = If_DsdManGetCellStr(pIfMan->pIfDsdMan);
          pcVar9 = Abc_UtilStrsav(pcVar9);
          p_01->pCellStr = pcVar9;
          iVar2 = local_438->nSize;
          iVar3 = Vec_IntEntry(local_438,0);
          iVar5 = Vec_IntEntry(local_438,1);
          if (iVar2 != iVar5 * iVar3 + 2) {
            __assert_fail("!vConfigs || Vec_IntSize(vConfigs) == 2 + Vec_IntEntry(vConfigs, 0) * Vec_IntEntry(vConfigs, 1)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                          ,0x7a7,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
          }
        }
        iVar2 = 0;
        while ((iVar2 < p_01->vCos->nSize &&
               (pGVar10 = Gia_ManCo(p_01,iVar2), pGVar10 != (Gia_Obj_t *)0x0))) {
          if ((~*(uint *)(pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff)) &
              0x1fffffff) != 0 &&
              -1 < (int)*(uint *)(pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff))) {
            iVar3 = Gia_ObjFaninId0p(p_01,pGVar10);
            iVar3 = Gia_ObjIsLut(p_01,iVar3);
            if (iVar3 == 0) {
              __assert_fail("!Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || Gia_ObjIsLut(pNew, Gia_ObjFaninId0p(pNew, pObj))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                            ,0x7ac,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
            }
          }
          iVar2 = iVar2 + 1;
        }
        for (iVar2 = 1; iVar2 < p_01->nObjs; iVar2 = iVar2 + 1) {
          iVar3 = Gia_ObjIsLut(p_01,iVar2);
          if (iVar3 != 0) {
            for (lVar15 = 0; iVar3 = Gia_ObjLutSize(p_01,iVar2), lVar15 < iVar3; lVar15 = lVar15 + 1
                ) {
              piVar11 = Gia_ObjLutFanins(p_01,iVar2);
              pGVar10 = Gia_ManObj(p_01,piVar11[lVar15]);
              if ((~*(uint *)pGVar10 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar10) {
                iVar3 = Gia_ObjId(p_01,pGVar10);
                iVar3 = Gia_ObjIsLut(p_01,iVar3);
                if (iVar3 == 0) {
                  __assert_fail("!Gia_ObjIsAnd(pFanin) || Gia_ObjIsLut(pNew, Gia_ObjId(pNew, pFanin))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                                ,0x7b3,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
                }
              }
            }
          }
        }
        iVar2 = 0;
        while ((iVar2 < p_01->vCis->nSize &&
               (pGVar10 = Gia_ManCi(p_01,iVar2), pGVar10 != (Gia_Obj_t *)0x0))) {
          iVar3 = Gia_ObjId(p_01,pGVar10);
          iVar3 = Gia_ObjIsLut(p_01,iVar3);
          iVar2 = iVar2 + 1;
          if (iVar3 != 0) {
            __assert_fail("!Gia_ObjIsLut(pNew, Gia_ObjId(pNew, pObj))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                          ,0x7b9,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
          }
        }
        if (local_428 != (Vec_Str_t *)0x0) {
          memset(Buffer,0,1000);
          if (pIfMan->pName == (char *)0x0) {
            pcVar9 = "nameless_";
          }
          else {
            pcVar9 = Extra_FileNameGeneric(pIfMan->pName);
          }
          sprintf(Buffer,"%s_configs.txt",pcVar9);
          free(pcVar9);
          __s = fopen(Buffer,"wb");
          if (__s == (FILE *)0x0) {
            Vec_StrFree(local_428);
            pcVar9 = "Cannot open file \"%s\".\n";
          }
          else {
            Vec_StrPush(local_428,'\0');
            pcVar9 = local_428->pArray;
            __size = strlen(pcVar9);
            fwrite(pcVar9,__size,1,__s);
            Vec_StrFree(local_428);
            fclose(__s);
            pcVar9 = "Finished dumping configs into file \"%s\".\n";
          }
          printf(pcVar9,Buffer);
        }
        return p_01;
      }
      __assert_fail("pNew->vConfigs == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                    ,0x7a1,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
    }
    pIfObj = (If_Obj_t *)Vec_PtrEntry(pIfMan->vObjs,iVar2);
    uVar4 = *(uint *)pIfObj;
    if ((uVar4 & 0xe) != 2 && pIfObj->nRefs == 0) goto LAB_001f5e54;
    switch(uVar4 & 0xf) {
    case 1:
      (pIfObj->field_22).iCopy = 1;
      Vec_IntWriteEntry(p,0,p_00->nSize);
      Vec_IntPush(p_00,0);
      Vec_IntPush(p_00,0);
      break;
    case 2:
      iVar3 = Gia_ManAppendCi(p_01);
      goto LAB_001f5e4b;
    case 3:
      iVar3 = Abc_LitNotCond((pIfObj->pFanin0->field_22).iCopy,uVar4 >> 4 & 1);
      iVar3 = Gia_ManAppendCo(p_01,iVar3);
LAB_001f5e4b:
      (pIfObj->field_22).iCopy = iVar3;
      break;
    case 4:
      pCut = &pIfObj->CutBest;
      pIVar6 = pIfMan->pPars;
      if (((((pIVar6->fUseTtPerm == 0) && (pIVar6->fDelayOpt == 0)) &&
           ((pIVar6->fDelayOptLut == 0 &&
            ((pIVar6->fDsdBalance == 0 && (pIVar6->pLutStruct == (char *)0x0)))))) &&
          (pIVar6->fUserRecLib == 0)) &&
         (((((pIVar6->fUserSesLib == 0 && (pIVar6->nGateSize == 0)) && (pIVar6->fEnableCheck75 == 0)
            ) && ((pIVar6->fEnableCheck75u == 0 && (pIVar6->fEnableCheck07 == 0)))) &&
          ((pIVar6->fUseDsdTune == 0 && ((pIVar6->fUseCofVars == 0 && (pIVar6->fUseAndVars == 0)))))
          ))) {
        If_CutRotatePins(pIfMan,pCut);
      }
      p_04->nSize = 0;
      uVar14 = 0;
      while ((uVar14 < (byte)(pIfObj->CutBest).field_0x1f &&
             (pIVar7 = If_ManObj(pIfMan,*(int *)(&pIfObj[1].field_0x0 + uVar14 * 4)),
             pIVar7 != (If_Obj_t *)0x0))) {
        Vec_IntPush(p_04,(pIVar7->field_22).iCopy);
        uVar14 = uVar14 + 1;
      }
      pIVar6 = pIfMan->pPars;
      iVar3 = pIVar6->fUseDsd;
      if ((iVar3 != 0) && (pIVar6->pLutStruct != (char *)0x0)) {
        if (local_430 == (sat_solver *)0x0) {
          local_430 = (sat_solver *)If_ManSatBuildXY(*pIVar6->pLutStruct + -0x30);
          pIVar6 = pIfMan->pPars;
          if (pIVar6->pLutStruct != (char *)0x0) goto LAB_001f5d49;
LAB_001f5e05:
          pwVar8 = If_CutTruthW(pIfMan,pCut);
          iVar3 = Gia_ManFromIfLogicCreateLut(p_01,pwVar8,p_04,p_03,p,p_00);
        }
        else {
LAB_001f5d49:
          if (pIVar6->fDeriveLuts == 0) goto LAB_001f5e05;
          iVar3 = Gia_ManFromIfLogicFindLut
                            (pIfMan,p_01,pCut,local_430,p_04,p_02,p_03,p,p_00,local_440);
        }
        (pIfObj->field_22).iCopy = iVar3;
        iVar3 = Abc_LitNotCond(iVar3,*(uint *)&(pIfObj->CutBest).field_0x1c >> 0xc & 1);
        goto LAB_001f5e4b;
      }
      if (pIVar6->fUseAndVars != 0) {
        if (pIVar6->fUseCofVars == 0) {
          if (pIVar6->fDeriveLuts == 0) goto LAB_001f5ef8;
LAB_001f5e63:
          if ((int)(uint)(byte)(pIfObj->CutBest).field_0x1f <= pIVar6->nLutSize / 2)
          goto LAB_001f5ea3;
LAB_001f5e77:
          iVar3 = Gia_ManFromIfLogicAndVars(p_01,pIfMan,pCut,p_04,p_05,p_03,p,p_00);
        }
        else {
          if (pIVar6->fDeriveLuts == 0) goto LAB_001f5ea7;
          if ((int)(uint)(byte)(pIfObj->CutBest).field_0x1f <= pIVar6->nLutSize / 2)
          goto LAB_001f5e63;
          iVar3 = Abc_Lit2Var((pIfObj->CutBest).iCutFunc);
          iVar3 = Vec_IntEntry(pIfMan->vTtDecs[(byte)(pIfObj->CutBest).field_0x1f],iVar3);
          if (iVar3 != 0) goto LAB_001f5e77;
LAB_001f5ec3:
          iVar3 = Gia_ManFromIfLogicCofVars(p_01,pIfMan,pCut,p_04,p_05,p_03,p,p_00);
        }
        (pIfObj->field_22).iCopy = iVar3;
        break;
      }
LAB_001f5ea3:
      if (pIVar6->fUseCofVars == 0) {
LAB_001f5ef8:
        if (pIVar6->fDeriveLuts != 0) goto LAB_001f5f01;
LAB_001f5f0b:
        if (iVar3 == 0) {
LAB_001f5f0f:
          if ((pIVar6->fUseTtPerm == 0) &&
             (pIVar6->pFuncCell2 ==
              (_func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr *)0x0)) {
            iVar5 = 0;
            iVar3 = Gia_ManNodeIfToGia(p_01,pIfMan,pIfObj,p_04,0);
            (pIfObj->field_22).iCopy = iVar3;
            iVar3 = Abc_Lit2Var(iVar3);
            Vec_IntSetEntry(p,iVar3,p_00->nSize);
            Vec_IntPush(p_00,p_04->nSize);
            while (iVar3 = p_04->nSize, iVar5 < iVar3) {
              iVar3 = Vec_IntEntry(p_04,iVar5);
              uVar4 = Abc_Lit2Var(iVar3);
              uVar17 = Abc_Lit2Var((pIfObj->field_22).iCopy);
              iVar5 = iVar5 + 1;
              if (uVar17 <= uVar4) {
                __assert_fail("Abc_Lit2Var(Entry) < Abc_Lit2Var(pIfObj->iCopy)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                              ,0x773,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
              }
            }
            for (iVar5 = 0; iVar5 < iVar3; iVar5 = iVar5 + 1) {
              iVar3 = Vec_IntEntry(p_04,iVar5);
              iVar3 = Abc_Lit2Var(iVar3);
              Vec_IntPush(p_00,iVar3);
              iVar3 = p_04->nSize;
            }
            iVar3 = Abc_Lit2Var((pIfObj->field_22).iCopy);
            Vec_IntPush(p_00,iVar3);
            break;
          }
        }
      }
      else {
LAB_001f5ea7:
        if (pIVar6->fDeriveLuts == 0) goto LAB_001f5f0b;
        if (pIVar6->nLutSize / 2 < (int)(uint)(byte)(pIfObj->CutBest).field_0x1f) goto LAB_001f5ec3;
LAB_001f5f01:
        if (iVar3 == 0 && pIVar6->fTruth == 0) goto LAB_001f5f0f;
      }
      pwVar8 = If_CutTruthW(pIfMan,pCut);
      pIVar6 = pIfMan->pPars;
      if (pIVar6->fUseTtPerm != 0) {
        uVar14 = 0;
        while( true ) {
          uVar4 = *(uint *)&(pIfObj->CutBest).field_0x1c;
          uVar17 = uVar4 >> 0x18;
          if (uVar17 <= uVar14) break;
          if (((uint)(pIfObj->CutBest).uMaskFunc >> ((uint)uVar14 & 0x1f) & 1) != 0) {
            iVar3 = uVar17 - 6;
            bVar13 = (byte)iVar3 & 0x1f;
            uVar17 = 1 << bVar13;
            bVar12 = (byte)(1 << ((byte)uVar14 & 0x1f));
            if (iVar3 == 0 || uVar4 < 0x7000000) {
              *pwVar8 = (Gia_ManFromIfLogicNode::Truth6[uVar14] & *pwVar8) >> (bVar12 & 0x3f) |
                        *pwVar8 << (bVar12 & 0x3f) & Gia_ManFromIfLogicNode::Truth6[uVar14];
            }
            else if (uVar14 < 6) {
              if (1 << bVar13 < 1) {
                uVar17 = 0;
              }
              for (uVar16 = 0; uVar17 != uVar16; uVar16 = uVar16 + 1) {
                pwVar8[uVar16] =
                     (Gia_ManFromIfLogicNode::Truth6[uVar14] & pwVar8[uVar16]) >> (bVar12 & 0x3f) |
                     pwVar8[uVar16] << (bVar12 & 0x3f) & Gia_ManFromIfLogicNode::Truth6[uVar14];
              }
            }
            else {
              bVar13 = (byte)uVar14 - 6;
              uVar4 = 1 << (bVar13 & 0x1f);
              iVar3 = 2 << (bVar13 & 0x1f);
              uVar16 = 0;
              if (0 < (int)uVar4) {
                uVar16 = (ulong)uVar4;
              }
              pwVar18 = pwVar8 + (int)uVar4;
              for (pwVar19 = pwVar8; pwVar19 < pwVar8 + (int)uVar17; pwVar19 = pwVar19 + iVar3) {
                for (uVar20 = 0; uVar16 != uVar20; uVar20 = uVar20 + 1) {
                  wVar1 = pwVar19[uVar20];
                  pwVar19[uVar20] = pwVar18[uVar20];
                  pwVar18[uVar20] = wVar1;
                }
                pwVar18 = pwVar18 + iVar3;
              }
            }
          }
          uVar14 = uVar14 + 1;
        }
      }
      uVar4 = 1;
      if (pIVar6->fEnableCheck75 == 0) {
        uVar4 = (uint)(pIVar6->fEnableCheck75u != 0);
      }
      iVar3 = Gia_ManFromIfLogicNode
                        (pIfMan,p_01,iVar2,p_04,p_05,pwVar8,pIVar6->pLutStruct,p_03,p,p_00,local_440
                         ,uVar4,pIVar6->fEnableCheck07);
      (pIfObj->field_22).iCopy = iVar3;
      iVar3 = Abc_LitNotCond(iVar3,*(uint *)&(pIfObj->CutBest).field_0x1c >> 0xc & 1);
      (pIfObj->field_22).iCopy = iVar3;
      if ((local_438 != (Vec_Int_t *)0x0) && (1 < p_04->nSize)) {
        iVar3 = Abc_Lit2Var(iVar3);
        pGVar10 = Gia_ManObj(p_01,iVar3);
        if (((~*(uint *)pGVar10 & 0x9fffffff) != 0) && (1 < (pIfObj->field_22).iCopy)) {
          Gia_ManFromIfGetConfig(local_438,pIfMan,pCut,(pIfObj->field_22).iCopy,local_428);
        }
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                    ,0x785,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
    }
LAB_001f5e54:
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManFromIfLogic( If_Man_t * pIfMan )
{
    int fWriteConfigs = 1;
    Gia_Man_t * pNew, * pHashed = NULL;
    If_Cut_t * pCutBest;
    If_Obj_t * pIfObj, * pIfLeaf;
    Vec_Int_t * vMapping, * vMapping2, * vPacking = NULL, * vConfigs = NULL;
    Vec_Int_t * vLeaves, * vLeaves2, * vCover, * vLits;
    Vec_Str_t * vConfigsStr = NULL;
    Ifn_Ntk_t * pNtkCell = NULL;
    sat_solver * pSat = NULL;
    int i, k, Entry;
    assert( !pIfMan->pPars->fDeriveLuts || pIfMan->pPars->fTruth );
//    if ( pIfMan->pPars->fEnableCheck07 )
//        pIfMan->pPars->fDeriveLuts = 0;
    // start mapping and packing
    vMapping  = Vec_IntStart( If_ManObjNum(pIfMan) );
    vMapping2 = Vec_IntStart( 1 );
    if ( pIfMan->pPars->fDeriveLuts && (pIfMan->pPars->pLutStruct || pIfMan->pPars->fEnableCheck75 || pIfMan->pPars->fEnableCheck75u || pIfMan->pPars->fEnableCheck07) )
    {
        vPacking = Vec_IntAlloc( 1000 );
        Vec_IntPush( vPacking, 0 );
    }
    if ( pIfMan->pPars->fUseDsdTune )
    {
        int nTtBitNum = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
        int nPermBitNum = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
        int nConfigInts = Abc_BitWordNum(nTtBitNum + nPermBitNum + 1);
        vConfigs = Vec_IntAlloc( 1000 );
        Vec_IntPush( vConfigs, 0 );
        Vec_IntPush( vConfigs, nConfigInts );
        if ( fWriteConfigs )
            vConfigsStr = Vec_StrAlloc( 1000 );
    }
    // create new manager
    pNew = Gia_ManStart( If_ManObjNum(pIfMan) );
    // iterate through nodes used in the mapping
    vLits    = Vec_IntAlloc( 1000 );
    vCover   = Vec_IntAlloc( 1 << 16 );
    vLeaves  = Vec_IntAlloc( 16 );
    vLeaves2 = Vec_IntAlloc( 16 );
    If_ManCleanCutData( pIfMan );
    If_ManForEachObj( pIfMan, pIfObj, i )
    {
        if ( pIfObj->nRefs == 0 && !If_ObjIsTerm(pIfObj) )
            continue;
        if ( If_ObjIsAnd(pIfObj) )
        {
            pCutBest = If_ObjCutBest( pIfObj );
            // perform sorting of cut leaves by delay, so that the slowest pin drives the fastest input of the LUT
            if ( !pIfMan->pPars->fUseTtPerm && !pIfMan->pPars->fDelayOpt && !pIfMan->pPars->fDelayOptLut && !pIfMan->pPars->fDsdBalance && 
                 !pIfMan->pPars->pLutStruct && !pIfMan->pPars->fUserRecLib && !pIfMan->pPars->fUserSesLib && !pIfMan->pPars->nGateSize && 
                 !pIfMan->pPars->fEnableCheck75 && !pIfMan->pPars->fEnableCheck75u && !pIfMan->pPars->fEnableCheck07 && !pIfMan->pPars->fUseDsdTune && 
                 !pIfMan->pPars->fUseCofVars && !pIfMan->pPars->fUseAndVars )
                If_CutRotatePins( pIfMan, pCutBest );
            // collect leaves of the best cut
            Vec_IntClear( vLeaves );
            If_CutForEachLeaf( pIfMan, pCutBest, pIfLeaf, k )
                Vec_IntPush( vLeaves, pIfLeaf->iCopy );
            // perform one of the two types of mapping: with and without structures
            if ( pIfMan->pPars->fUseDsd && pIfMan->pPars->pLutStruct )
            {
                if ( pSat == NULL )
                    pSat = (sat_solver *)If_ManSatBuildXY( (int)(pIfMan->pPars->pLutStruct[0] - '0') );
                if ( pIfMan->pPars->pLutStruct && pIfMan->pPars->fDeriveLuts )
                    pIfObj->iCopy = Gia_ManFromIfLogicFindLut( pIfMan, pNew, pCutBest, pSat, vLeaves, vLits, vCover, vMapping, vMapping2, vPacking );
                else
                    pIfObj->iCopy = Gia_ManFromIfLogicCreateLut( pNew, If_CutTruthW(pIfMan, pCutBest), vLeaves, vCover, vMapping, vMapping2 );
                pIfObj->iCopy = Abc_LitNotCond( pIfObj->iCopy, pCutBest->fCompl );
            }
/*
            else if ( pIfMan->pPars->fUseDsd && pIfMan->pPars->fUseDsdTune && pIfMan->pPars->fDeriveLuts )
            {
                if ( pNtkCell == NULL )
                {
                    assert( If_DsdManGetCellStr(pIfMan->pIfDsdMan) != NULL );
                    pNtkCell = Ifn_NtkParse( If_DsdManGetCellStr(pIfMan->pIfDsdMan) );
                    nLutMax = Ifn_NtkLutSizeMax( pNtkCell );
                    pHashed = Gia_ManStart( 10000 );
                    Vec_IntFillExtra( &pHashed->vCopies, 10000, -1 );
                    for ( k = 0; k < pIfMan->pPars->nLutSize; k++ )
                        Gia_ManAppendCi( pHashed );
                    Gia_ManHashAlloc( pHashed );
                }
                pIfObj->iCopy = Gia_ManFromIfLogicFindCell( pIfMan, pNew, pHashed, pCutBest, pNtkCell, nLutMax, vLeaves, vLits, vCover, vMapping, vMapping2, vConfigs );
                pIfObj->iCopy = Abc_LitNotCond( pIfObj->iCopy, pCutBest->fCompl );
            }
*/
            else if ( pIfMan->pPars->fUseAndVars && pIfMan->pPars->fUseCofVars && pIfMan->pPars->fDeriveLuts && (int)pCutBest->nLeaves > pIfMan->pPars->nLutSize/2 )
            {
                int truthId = Abc_Lit2Var(pCutBest->iCutFunc);
                int Mask = Vec_IntEntry(pIfMan->vTtDecs[pCutBest->nLeaves], truthId);
                if ( Mask )
                    pIfObj->iCopy = Gia_ManFromIfLogicAndVars( pNew, pIfMan, pCutBest, vLeaves, vLeaves2, vCover, vMapping, vMapping2 );
                else
                    pIfObj->iCopy = Gia_ManFromIfLogicCofVars( pNew, pIfMan, pCutBest, vLeaves, vLeaves2, vCover, vMapping, vMapping2 );
            }
            else if ( pIfMan->pPars->fUseAndVars && pIfMan->pPars->fDeriveLuts && (int)pCutBest->nLeaves > pIfMan->pPars->nLutSize/2 )
            {
                pIfObj->iCopy = Gia_ManFromIfLogicAndVars( pNew, pIfMan, pCutBest, vLeaves, vLeaves2, vCover, vMapping, vMapping2 );
            }
            else if ( pIfMan->pPars->fUseCofVars && pIfMan->pPars->fDeriveLuts && (int)pCutBest->nLeaves > pIfMan->pPars->nLutSize/2 )
            {
                pIfObj->iCopy = Gia_ManFromIfLogicCofVars( pNew, pIfMan, pCutBest, vLeaves, vLeaves2, vCover, vMapping, vMapping2 );
            }
            else if ( (pIfMan->pPars->fDeriveLuts && pIfMan->pPars->fTruth) || pIfMan->pPars->fUseDsd || pIfMan->pPars->fUseTtPerm || pIfMan->pPars->pFuncCell2 )
            {
                word * pTruth = If_CutTruthW(pIfMan, pCutBest);
                if ( pIfMan->pPars->fUseTtPerm )
                    for ( k = 0; k < (int)pCutBest->nLeaves; k++ )
                        if ( If_CutLeafBit(pCutBest, k) )
                            Abc_TtFlip( pTruth, Abc_TtWordNum(pCutBest->nLeaves), k );
                // perform decomposition of the cut
                pIfObj->iCopy = Gia_ManFromIfLogicNode( pIfMan, pNew, i, vLeaves, vLeaves2, pTruth, pIfMan->pPars->pLutStruct, vCover, vMapping, vMapping2, vPacking, (pIfMan->pPars->fEnableCheck75 || pIfMan->pPars->fEnableCheck75u), pIfMan->pPars->fEnableCheck07 );
                pIfObj->iCopy = Abc_LitNotCond( pIfObj->iCopy, pCutBest->fCompl );
                if ( vConfigs && Vec_IntSize(vLeaves) > 1 && !Gia_ObjIsCi(Gia_ManObj(pNew, Abc_Lit2Var(pIfObj->iCopy))) && pIfObj->iCopy > 1 )
                    Gia_ManFromIfGetConfig( vConfigs, pIfMan, pCutBest, pIfObj->iCopy, vConfigsStr );
            }
            else
            {
                pIfObj->iCopy = Gia_ManNodeIfToGia( pNew, pIfMan, pIfObj, vLeaves, 0 );
                // write mapping
                Vec_IntSetEntry( vMapping, Abc_Lit2Var(pIfObj->iCopy), Vec_IntSize(vMapping2) );
                Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
                Vec_IntForEachEntry( vLeaves, Entry, k )
                    assert( Abc_Lit2Var(Entry) < Abc_Lit2Var(pIfObj->iCopy) );
                Vec_IntForEachEntry( vLeaves, Entry, k )
                    Vec_IntPush( vMapping2, Abc_Lit2Var(Entry)  );
                Vec_IntPush( vMapping2, Abc_Lit2Var(pIfObj->iCopy) );
            }
        }
        else if ( If_ObjIsCi(pIfObj) )
            pIfObj->iCopy = Gia_ManAppendCi(pNew);
        else if ( If_ObjIsCo(pIfObj) )
            pIfObj->iCopy = Gia_ManAppendCo( pNew, Abc_LitNotCond(If_ObjFanin0(pIfObj)->iCopy, If_ObjFaninC0(pIfObj)) );
        else if ( If_ObjIsConst1(pIfObj) )
        {
            pIfObj->iCopy = 1;
            // create const LUT
            Vec_IntWriteEntry( vMapping, 0, Vec_IntSize(vMapping2) );
            Vec_IntPush( vMapping2, 0 );
            Vec_IntPush( vMapping2, 0 );
        }
        else assert( 0 );
    }
    Vec_IntFree( vLits );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vLeaves2 );
    if ( pNtkCell )
        ABC_FREE( pNtkCell );
    if ( pSat )
        sat_solver_delete(pSat);
    if ( pHashed )
        Gia_ManStop( pHashed );
//    printf( "Mapping array size:  IfMan = %d. Gia = %d. Increase = %.2f\n", 
//        If_ManObjNum(pIfMan), Gia_ManObjNum(pNew), 1.0 * Gia_ManObjNum(pNew) / If_ManObjNum(pIfMan) );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, Entry, i )
        if ( Entry > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    assert( pNew->vPacking == NULL );
    assert( pNew->vConfigs == NULL );
    assert( pNew->pCellStr == NULL );
    pNew->vMapping = vMapping;
    pNew->vPacking = vPacking;
    pNew->vConfigs = vConfigs;
    pNew->pCellStr = vConfigs ? Abc_UtilStrsav( If_DsdManGetCellStr(pIfMan->pIfDsdMan) ) : NULL;
    assert( !vConfigs || Vec_IntSize(vConfigs) == 2 + Vec_IntEntry(vConfigs, 0) * Vec_IntEntry(vConfigs, 1) );
    // verify that COs have mapping
    {
        Gia_Obj_t * pObj;
        Gia_ManForEachCo( pNew, pObj, i )
           assert( !Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || Gia_ObjIsLut(pNew, Gia_ObjFaninId0p(pNew, pObj)) );
    }
    // verify that internal nodes have mapping
    {
        Gia_Obj_t * pFanin;
        Gia_ManForEachLut( pNew, i )
            Gia_LutForEachFaninObj( pNew, i, pFanin, k )
                assert( !Gia_ObjIsAnd(pFanin) || Gia_ObjIsLut(pNew, Gia_ObjId(pNew, pFanin)) );
    }
    // verify that CIs have no mapping
    {
        Gia_Obj_t * pObj;
        Gia_ManForEachCi( pNew, pObj, i )
           assert( !Gia_ObjIsLut(pNew, Gia_ObjId(pNew, pObj)) );
    }
    // dump configuration strings
    if ( vConfigsStr )
    {
        FILE * pFile; int status;
        char * pStr, Buffer[1000] = {0};
        const char * pNameGen = pIfMan->pName? Extra_FileNameGeneric( pIfMan->pName ) : "nameless_";
        sprintf( Buffer, "%s_configs.txt", pNameGen );
        ABC_FREE( pNameGen );
        pFile = fopen( Buffer, "wb" );
        if ( pFile == NULL )
        {
            Vec_StrFree( vConfigsStr );
            printf( "Cannot open file \"%s\".\n", Buffer );
            return pNew;
        }
        Vec_StrPush( vConfigsStr, '\0' );
        pStr = Vec_StrArray(vConfigsStr);
        status = fwrite( pStr, strlen(pStr), 1, pFile );
        Vec_StrFree( vConfigsStr );
        fclose( pFile );
        printf( "Finished dumping configs into file \"%s\".\n", Buffer );
    }
    return pNew;
}